

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

Result __thiscall
spectest::CommandRunner::OnModuleCommand(CommandRunner *this,ModuleCommand *command)

{
  uint32_t line_number;
  Ref store;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
  *this_00;
  Enum EVar1;
  Ptr *out_trap;
  string_view module_filename;
  Ptr instance;
  Ptr module;
  string local_a8;
  Ptr trap;
  RefVec imports;
  Errors errors;
  
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  module_filename._M_str = (command->filename)._M_dataplus._M_p;
  module_filename._M_len = (command->filename)._M_string_length;
  ReadModule(&module,this,module_filename,&errors);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  out_trap = (Ptr *)0x0;
  wabt::FormatErrorsToFile(&errors,Binary,(LexerSourceLineFinder *)0x0,_stderr,&local_a8,Never,0x50)
  ;
  std::__cxx11::string::_M_dispose();
  if (module.obj_ == (Module *)0x0) {
    PrintError(this,(command->super_CommandMixin<(wabt::CommandType)0>).super_Command.line,
               "error reading module: \"%s\"",(command->filename)._M_dataplus._M_p);
    EVar1 = Error;
  }
  else {
    imports.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    imports.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    imports.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    PopulateImports(this,&module,&imports);
    trap.obj_ = (Trap *)0x0;
    trap.store_ = (Store *)0x0;
    trap.root_index_ = 0;
    store = wabt::interp::RefPtr<wabt::interp::Module>::ref(&module);
    wabt::interp::Instance::Instantiate
              (&instance,(Instance *)this,(Store *)store.index,(Ref)&imports,(RefVec *)&trap,
               out_trap);
    if (trap.obj_ == (Trap *)0x0) {
      PopulateExports(this,&instance,&this->last_instance_);
      EVar1 = Ok;
      if ((command->name)._M_string_length != 0) {
        this_00 = &std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>_>_>_>
                   ::operator[](&this->instances_,&command->name)->_M_t;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
        ::operator=(this_00,&(this->last_instance_)._M_t);
      }
    }
    else {
      if (instance.obj_ != (Instance *)0x0) {
        __assert_fail("!instance",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/spectest-interp.cc"
                      ,0x5e5,
                      "wabt::Result spectest::CommandRunner::OnModuleCommand(const ModuleCommand *)"
                     );
      }
      line_number = (command->super_CommandMixin<(wabt::CommandType)0>).super_Command.line;
      std::__cxx11::string::string((string *)&local_a8,(string *)&(trap.obj_)->message_);
      PrintError(this,line_number,"error instantiating module: \"%s\"",local_a8._M_dataplus._M_p);
      std::__cxx11::string::_M_dispose();
      EVar1 = Error;
    }
    wabt::interp::RefPtr<wabt::interp::Instance>::reset(&instance);
    wabt::interp::RefPtr<wabt::interp::Trap>::reset(&trap);
    std::_Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::~_Vector_base
              (&imports.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>);
  }
  wabt::interp::RefPtr<wabt::interp::Module>::reset(&module);
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&errors);
  return (Result)EVar1;
}

Assistant:

wabt::Result CommandRunner::OnModuleCommand(const ModuleCommand* command) {
  Errors errors;
  auto module = ReadModule(command->filename, &errors);
  FormatErrorsToFile(errors, Location::Type::Binary);

  if (!module) {
    PrintError(command->line, "error reading module: \"%s\"",
               command->filename.c_str());
    return wabt::Result::Error;
  }

  RefVec imports;
  PopulateImports(module, &imports);

  Trap::Ptr trap;
  auto instance = Instance::Instantiate(store_, module.ref(), imports, &trap);
  if (trap) {
    assert(!instance);
    PrintError(command->line, "error instantiating module: \"%s\"",
               trap->message().c_str());
    return wabt::Result::Error;
  }

  PopulateExports(instance, &last_instance_);
  if (!command->name.empty()) {
    instances_[command->name] = last_instance_;
  }

  return wabt::Result::Ok;
}